

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * atomdiscard_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *e;
  int spos_local;
  void *v_local;
  iasctx *ctx_local;
  
  if ((spos == ctx->atomsnum) || (ctx->atoms[spos]->type != LITEM_EXPR)) {
    ctx_local = (iasctx *)0x0;
  }
  else if (ctx->atoms[spos]->expr->type == EASM_EXPR_DISCARD) {
    ctx_local = (iasctx *)alwaysmatches(spos + 1);
  }
  else {
    ctx_local = (iasctx *)0x0;
  }
  return (matches *)ctx_local;
}

Assistant:

struct matches *atomdiscard_a APROTO {
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct easm_expr *e = ctx->atoms[spos]->expr;
	if (e->type == EASM_EXPR_DISCARD) {
		return alwaysmatches(spos+1);
	} else {
		return 0;
	}
}